

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_button_text_image
               (nk_command_buffer *out,nk_rect *bounds,nk_rect *label,nk_rect *image,nk_flags state,
               nk_style_button *style,char *str,int len,nk_user_font *font,nk_image *img)

{
  nk_style_item *pnVar1;
  nk_style_item *background;
  nk_text text;
  nk_style_button *style_local;
  nk_flags state_local;
  nk_rect *image_local;
  nk_rect *label_local;
  nk_rect *bounds_local;
  nk_command_buffer *out_local;
  
  text._8_8_ = style;
  pnVar1 = nk_draw_button(out,bounds,state,style);
  if (pnVar1->type == NK_STYLE_ITEM_COLOR) {
    text.padding.x = *(float *)&(pnVar1->data).color;
  }
  else {
    text.padding.x = *(float *)(text._8_8_ + 100);
  }
  if ((state & 0x10) == 0) {
    if ((state & 0x20) == 0) {
      text.padding.y = *(float *)(text._8_8_ + 0x68);
    }
    else {
      text.padding.y = *(float *)(text._8_8_ + 0x70);
    }
  }
  else {
    text.padding.y = *(float *)(text._8_8_ + 0x6c);
  }
  background = (nk_style_item *)nk_vec2(0.0,0.0);
  nk_widget_text(out,*label,str,len,(nk_text *)&background,0x12,font);
  nk_draw_image(out,*image,img,(nk_color)0xffffffff);
  return;
}

Assistant:

NK_LIB void
nk_draw_button_text_image(struct nk_command_buffer *out,
    const struct nk_rect *bounds, const struct nk_rect *label,
    const struct nk_rect *image, nk_flags state, const struct nk_style_button *style,
    const char *str, int len, const struct nk_user_font *font,
    const struct nk_image *img)
{
    struct nk_text text;
    const struct nk_style_item *background;
    background = nk_draw_button(out, bounds, state, style);

    /* select correct colors */
    if (background->type == NK_STYLE_ITEM_COLOR)
        text.background = background->data.color;
    else text.background = style->text_background;
    if (state & NK_WIDGET_STATE_HOVER)
        text.text = style->text_hover;
    else if (state & NK_WIDGET_STATE_ACTIVED)
        text.text = style->text_active;
    else text.text = style->text_normal;

    text.padding = nk_vec2(0,0);
    nk_widget_text(out, *label, str, len, &text, NK_TEXT_CENTERED, font);
    nk_draw_image(out, *image, img, nk_white);
}